

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.cpp
# Opt level: O1

void __thiscall
TPZEquationFilter::Gather(TPZEquationFilter *this,TPZBaseMatrix *large,TPZBaseMatrix *gathered)

{
  TPZFMatrix<double> *large_00;
  TPZFMatrix<double> *gathered_00;
  TPZFMatrix<std::complex<double>_> *large_01;
  TPZFMatrix<std::complex<double>_> *gathered_01;
  
  large_00 = (TPZFMatrix<double> *)
             __dynamic_cast(large,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
  gathered_00 = (TPZFMatrix<double> *)
                __dynamic_cast(gathered,&TPZBaseMatrix::typeinfo,&TPZFMatrix<double>::typeinfo,0);
  if (gathered_00 != (TPZFMatrix<double> *)0x0 && large_00 != (TPZFMatrix<double> *)0x0) {
    GatherInternal<double>(this,large_00,gathered_00);
    return;
  }
  large_01 = (TPZFMatrix<std::complex<double>_> *)
             __dynamic_cast(large,&TPZBaseMatrix::typeinfo,
                            &TPZFMatrix<std::complex<double>>::typeinfo,0);
  gathered_01 = (TPZFMatrix<std::complex<double>_> *)
                __dynamic_cast(gathered,&TPZBaseMatrix::typeinfo,
                               &TPZFMatrix<std::complex<double>>::typeinfo,0);
  if (gathered_01 != (TPZFMatrix<std::complex<double>_> *)0x0 &&
      large_01 != (TPZFMatrix<std::complex<double>_> *)0x0) {
    GatherInternal<std::complex<double>>(this,large_01,gathered_01);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZEquationFilter::Gather(const TPZBaseMatrix &, TPZBaseMatrix &) const",0x4c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," Incompatible types. Aborting...\n",0x21);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZEquationFilter.cpp"
             ,0x2a);
}

Assistant:

void TPZEquationFilter::Gather(const TPZBaseMatrix &large, TPZBaseMatrix &gathered) const {
  auto *large_cast_state = dynamic_cast<const TPZFMatrix<STATE> *>(&large);
  auto *gathered_cast_state = dynamic_cast<TPZFMatrix<STATE> *>(&gathered);
  if (large_cast_state && gathered_cast_state) {
    return GatherInternal(*large_cast_state, *gathered_cast_state);
  }
  auto *large_cast_cstate = dynamic_cast<const TPZFMatrix<CSTATE> *>(&large);
  auto *gathered_cast_cstate = dynamic_cast<TPZFMatrix<CSTATE> *>(&gathered);
  if (large_cast_cstate && gathered_cast_cstate) {
    return GatherInternal(*large_cast_cstate, *gathered_cast_cstate);
  }

  PZError << __PRETTY_FUNCTION__;
  PZError << " Incompatible types. Aborting...\n";
  DebugStop();
}